

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcAttach.c
# Opt level: O1

int Abc_NtkAttach(Abc_Ntk_t *pNtk)

{
  char *pcVar1;
  size_t __size;
  byte bVar2;
  Abc_Obj_t *pObj;
  int *piVar3;
  void **ppvVar4;
  int iVar5;
  int iVar6;
  Mio_Library_t *pLib;
  long lVar7;
  Mio_Gate_t **__ptr;
  long *__ptr_00;
  void *pvVar8;
  Vec_Ptr_t *pVVar9;
  Mio_Gate_t *pMVar10;
  uint uVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  long lVar16;
  char *pcVar17;
  char *pcVar18;
  uint uVar19;
  ulong uVar20;
  int nGates;
  uint uTruths [6] [2];
  int Perm [10];
  int pTempInts [10];
  uint local_d4;
  uint local_d0 [2];
  Mio_Library_t *local_c8;
  uint local_c0 [26];
  int aiStack_58 [10];
  
  if ((pNtk->ntkFunc != ABC_FUNC_SOP) || (pNtk->ntkType != ABC_NTK_LOGIC)) {
    __assert_fail("Abc_NtkIsSopLogic(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcAttach.c"
                  ,0x45,"int Abc_NtkAttach(Abc_Ntk_t *)");
  }
  iVar5 = 0;
  pLib = (Mio_Library_t *)Abc_FrameReadLibGen();
  if (pLib == (Mio_Library_t *)0x0) {
    puts("The current library is not available.");
  }
  else {
    lVar7 = 0;
    do {
      local_c0[lVar7 * 2 + 2] = 0;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 5);
    uVar11 = 0;
    do {
      lVar7 = 0;
      do {
        if ((uVar11 >> ((uint)lVar7 & 0x1f) & 1) != 0) {
          local_c0[lVar7 * 2 + 2] = local_c0[lVar7 * 2 + 2] | 1 << ((byte)uVar11 & 0x1f);
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 != 5);
      uVar11 = uVar11 + 1;
    } while (uVar11 != 0x20);
    lVar7 = 0;
    do {
      local_c0[lVar7 * 2 + 3] = local_c0[lVar7 * 2 + 2];
      lVar7 = lVar7 + 1;
    } while (lVar7 != 5);
    local_c0[0xc] = 0;
    local_c0[0xd] = 0xffffffff;
    __ptr = Mio_CollectRoots(pLib,6,1e+20,1,(int *)&local_d4,0);
    lVar7 = (long)(int)local_d4;
    __size = lVar7 * 8;
    __ptr_00 = (long *)malloc(__size);
    pvVar8 = malloc(__size);
    *__ptr_00 = (long)pvVar8;
    if (1 < lVar7) {
      lVar7 = *__ptr_00;
      lVar12 = 8;
      do {
        *(long *)((long)__ptr_00 + lVar12) = lVar7 + lVar12;
        lVar12 = lVar12 + 8;
      } while (__size - lVar12 != 0);
    }
    if (0 < (int)local_d4) {
      lVar7 = 0;
      do {
        pMVar10 = __ptr[lVar7];
        iVar5 = Mio_GateReadPinNum(pMVar10);
        Mio_DeriveTruthTable(pMVar10,(uint (*) [2])(local_c0 + 2),iVar5,6,(uint *)__ptr_00[lVar7]);
        lVar7 = lVar7 + 1;
      } while (lVar7 < (int)local_d4);
    }
    Abc_NtkCleanCopy(pNtk);
    pVVar9 = pNtk->vObjs;
    if (0 < pVVar9->nSize) {
      lVar7 = 0;
      local_c8 = pLib;
LAB_00295f70:
      uVar11 = local_d4;
      pObj = (Abc_Obj_t *)pVVar9->pArray[lVar7];
      if ((pObj != (Abc_Obj_t *)0x0) && ((*(uint *)&pObj->field_0x14 & 0xf) == 7)) {
        iVar5 = (pObj->vFanins).nSize;
        if (iVar5 == 1) {
          iVar5 = Abc_SopIsBuf((char *)(pObj->field_5).pData);
          if (iVar5 == 0) {
            pMVar10 = Mio_LibraryReadInv(pLib);
          }
          else {
            pMVar10 = Mio_LibraryReadBuf(pLib);
          }
LAB_002960ca:
          (pObj->field_6).pCopy = (Abc_Obj_t *)pMVar10;
          goto LAB_0029625d;
        }
        if (iVar5 == 0) {
          iVar5 = Abc_SopIsConst1((char *)(pObj->field_5).pData);
          if (iVar5 == 0) {
            pMVar10 = Mio_LibraryReadConst0(pLib);
          }
          else {
            pMVar10 = Mio_LibraryReadConst1(pLib);
          }
          goto LAB_002960ca;
        }
        if (6 < iVar5) {
          pcVar17 = Abc_ObjName(pObj);
          pcVar18 = "Cannot attach gate with more than 6 inputs to node %s.\n";
          goto LAB_002963e5;
        }
        uVar20 = (ulong)local_d4;
        pcVar17 = (char *)(pObj->field_5).pData;
        iVar5 = Abc_SopGetVarNum(pcVar17);
        local_d0[0] = 0;
        local_d0[1] = 0;
        if (*pcVar17 != '\0') {
          local_d0[1] = 0;
          local_d0[0] = 0;
          pcVar18 = pcVar17;
LAB_00296010:
          uVar15 = 0xffffffff;
          lVar12 = 0;
          uVar19 = 0xffffffff;
          do {
            bVar2 = pcVar18[lVar12];
            if (bVar2 < 0x31) {
              if (bVar2 == 0x30) {
                uVar15 = uVar15 & ~local_c0[lVar12 * 2 + 2];
                uVar19 = uVar19 & ~local_c0[lVar12 * 2 + 3];
              }
              else if ((bVar2 == 0) || (bVar2 == 0x20)) goto LAB_00296065;
            }
            else if (bVar2 == 0x31) {
              uVar15 = uVar15 & local_c0[lVar12 * 2 + 2];
              uVar19 = uVar19 & local_c0[lVar12 * 2 + 3];
            }
            lVar12 = lVar12 + 1;
          } while( true );
        }
        goto LAB_0029607c;
      }
      goto LAB_0029625d;
    }
LAB_0029628b:
    if ((void *)*__ptr_00 != (void *)0x0) {
      free((void *)*__ptr_00);
      *__ptr_00 = 0;
    }
    free(__ptr_00);
    if (__ptr != (Mio_Gate_t **)0x0) {
      free(__ptr);
    }
    if (s_pPerms != (char **)0x0) {
      free(s_pPerms);
      s_pPerms = (char **)0x0;
    }
    lVar7 = (long)pNtk->vObjs->nSize;
    if (0 < lVar7) {
      lVar12 = 0;
      do {
        pvVar8 = pNtk->vObjs->pArray[lVar12];
        if (((pvVar8 != (void *)0x0) && ((*(uint *)((long)pvVar8 + 0x14) & 0xf) == 7)) &&
           (*(long *)((long)pvVar8 + 0x40) == 0)) {
          pcVar17 = 
          "Some elementary gates (constant, buffer, or inverter) are missing in the library.";
          goto LAB_002963aa;
        }
        lVar12 = lVar12 + 1;
      } while (lVar7 != lVar12);
    }
    pVVar9 = pNtk->vObjs;
    if (0 < pVVar9->nSize) {
      lVar7 = 0;
      do {
        pvVar8 = pVVar9->pArray[lVar7];
        if ((pvVar8 != (void *)0x0) && ((*(uint *)((long)pvVar8 + 0x14) & 0xf) == 7)) {
          *(undefined8 *)((long)pvVar8 + 0x38) = *(undefined8 *)((long)pvVar8 + 0x40);
          *(undefined8 *)((long)pvVar8 + 0x40) = 0;
        }
        lVar7 = lVar7 + 1;
        pVVar9 = pNtk->vObjs;
      } while (lVar7 < pVVar9->nSize);
    }
    pNtk->ntkFunc = ABC_FUNC_MAP;
    Extra_MmFlexStop((Extra_MmFlex_t *)pNtk->pManFunc);
    pNtk->pManFunc = pLib;
    puts("Library gates are successfully attached to the nodes.");
    iVar6 = Abc_NtkCheck(pNtk);
    iVar5 = 1;
    if (iVar6 == 0) {
      pcVar17 = "Abc_NtkAttach: The network check has failed.";
LAB_002963aa:
      puts(pcVar17);
      iVar5 = 0;
    }
  }
  return iVar5;
LAB_00296065:
  local_d0[0] = local_d0[0] | uVar15;
  local_d0[1] = local_d0[1] | uVar19;
  pcVar1 = pcVar18 + (iVar5 + 3);
  pcVar18 = pcVar18 + (iVar5 + 3);
  if (*pcVar1 == '\0') goto code_r0x00296074;
  goto LAB_00296010;
code_r0x002961d6:
  lVar12 = lVar12 + 1;
  if (lVar12 == s_nPerms) goto LAB_002961e2;
  goto LAB_00296142;
code_r0x00296074:
LAB_0029607c:
  iVar5 = Abc_SopGetPhase(pcVar17);
  if (iVar5 == 0) {
    local_d0[1] = ~local_d0[1];
    local_d0[0] = ~local_d0[0];
  }
  uVar13 = 0xffffffff;
  if (0 < (int)uVar11) {
    uVar14 = 0;
    do {
      if ((*(uint *)__ptr_00[uVar14] == local_d0[0]) &&
         (((uint *)__ptr_00[uVar14])[1] == local_d0[1])) {
        uVar13 = uVar14 & 0xffffffff;
        break;
      }
      uVar14 = uVar14 + 1;
    } while (uVar20 != uVar14);
  }
  if ((int)uVar13 < 0) {
    if (s_pPerms == (char **)0x0) {
      s_pPerms = Extra_Permutations(6);
      s_nPerms = Extra_Factorial(6);
    }
    if (0 < (long)s_nPerms) {
      lVar12 = 0;
LAB_00296142:
      pcVar17 = s_pPerms[lVar12];
      local_c0[0] = 0;
      local_c0[1] = 0;
      uVar13 = 0;
      do {
        uVar15 = (uint)uVar13;
        if ((local_d0[uVar13 >> 5] >> (uVar15 & 0x1f) & 1) != 0) {
          lVar16 = 0;
          uVar19 = 0;
          do {
            if ((uVar15 >> ((uint)lVar16 & 0x1f) & 1) != 0) {
              uVar19 = uVar19 | 1 << ((byte)pcVar17[lVar16] & 0x1f);
            }
            lVar16 = lVar16 + 1;
          } while (lVar16 != 6);
          local_c0[(int)uVar19 >> 5] = local_c0[(int)uVar19 >> 5] | 1 << ((byte)uVar19 & 0x1f);
        }
        uVar13 = (ulong)(uVar15 + 1);
      } while (uVar15 + 1 != 0x40);
      uVar13 = 0xffffffff;
      if (0 < (int)uVar11) {
        uVar14 = 0;
        do {
          if ((*(uint *)__ptr_00[uVar14] == local_c0[0]) &&
             (((uint *)__ptr_00[uVar14])[1] == local_c0[1])) {
            uVar13 = uVar14 & 0xffffffff;
            break;
          }
          uVar14 = uVar14 + 1;
        } while (uVar20 != uVar14);
      }
      if ((int)uVar13 < 0) goto code_r0x002961d6;
      lVar12 = 0;
      do {
        local_c0[lVar12 + 0xe] = (int)pcVar17[lVar12];
        lVar12 = lVar12 + 1;
      } while (lVar12 != 6);
      goto LAB_002960ed;
    }
LAB_002961e2:
    pMVar10 = (Mio_Gate_t *)0x0;
  }
  else {
    lVar12 = 0;
    do {
      local_c0[lVar12 + 0xe] = (uint)lVar12;
      lVar12 = lVar12 + 1;
    } while (lVar12 != 6);
LAB_002960ed:
    pMVar10 = __ptr[uVar13];
  }
  if (pMVar10 != (Mio_Gate_t *)0x0) {
    iVar5 = (pObj->vFanins).nSize;
    lVar12 = (long)iVar5;
    if (0 < lVar12) {
      piVar3 = (pObj->vFanins).pArray;
      ppvVar4 = pObj->pNtk->vObjs->pArray;
      lVar16 = 0;
      do {
        aiStack_58[lVar16] = *(int *)((long)ppvVar4[piVar3[lVar16]] + 0x10);
        lVar16 = lVar16 + 1;
      } while (lVar12 != lVar16);
      if (0 < iVar5) {
        piVar3 = (pObj->vFanins).pArray;
        lVar16 = 0;
        do {
          piVar3[(int)local_c0[lVar16 + 0xe]] = aiStack_58[lVar16];
          lVar16 = lVar16 + 1;
        } while (lVar12 != lVar16);
      }
    }
    (pObj->field_6).pTemp = pMVar10;
    pLib = local_c8;
    if (pMVar10 != (Mio_Gate_t *)0x0) {
LAB_0029625d:
      lVar7 = lVar7 + 1;
      pVVar9 = pNtk->vObjs;
      if (pVVar9->nSize <= lVar7) goto LAB_0029628b;
      goto LAB_00295f70;
    }
  }
  pcVar17 = Abc_ObjName(pObj);
  pcVar18 = "Could not attach the library gate to node %s.\n";
LAB_002963e5:
  printf(pcVar18,pcVar17);
  if ((void *)*__ptr_00 != (void *)0x0) {
    free((void *)*__ptr_00);
    *__ptr_00 = 0;
  }
  free(__ptr_00);
  if (__ptr == (Mio_Gate_t **)0x0) {
    return 0;
  }
  free(__ptr);
  return 0;
}

Assistant:

int Abc_NtkAttach( Abc_Ntk_t * pNtk )
{
    Mio_Library_t * pGenlib;
    unsigned ** puTruthGates;
    unsigned uTruths[6][2];
    Abc_Obj_t * pNode;
    Mio_Gate_t ** ppGates;
    int nGates, nFanins, i;

    assert( Abc_NtkIsSopLogic(pNtk) );

    // check that the library is available
    pGenlib = (Mio_Library_t *)Abc_FrameReadLibGen();
    if ( pGenlib == NULL )
    {
        printf( "The current library is not available.\n" );
        return 0;
    }

    // start the truth tables
    Abc_AttachSetupTruthTables( uTruths );
    
    // collect all the gates
    ppGates = Mio_CollectRoots( pGenlib, 6, (float)1.0e+20, 1, &nGates, 0 );

    // derive the gate truth tables
    puTruthGates    = ABC_ALLOC( unsigned *, nGates );
    puTruthGates[0] = ABC_ALLOC( unsigned, 2 * nGates );
    for ( i = 1; i < nGates; i++ )
        puTruthGates[i] = puTruthGates[i-1] + 2;
    for ( i = 0; i < nGates; i++ )
        Mio_DeriveTruthTable( ppGates[i], uTruths, Mio_GateReadPinNum(ppGates[i]), 6, puTruthGates[i] );

    // assign the gates to pNode->pCopy
    Abc_NtkCleanCopy( pNtk );
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
        nFanins = Abc_ObjFaninNum(pNode);
        if ( nFanins == 0 )
        {
            if ( Abc_SopIsConst1((char *)pNode->pData) )
                pNode->pCopy = (Abc_Obj_t *)Mio_LibraryReadConst1(pGenlib);
            else
                pNode->pCopy = (Abc_Obj_t *)Mio_LibraryReadConst0(pGenlib);
        }
        else if ( nFanins == 1 )
        {
            if ( Abc_SopIsBuf((char *)pNode->pData) )
                pNode->pCopy = (Abc_Obj_t *)Mio_LibraryReadBuf(pGenlib);
            else
                pNode->pCopy = (Abc_Obj_t *)Mio_LibraryReadInv(pGenlib);
        }
        else if ( nFanins > 6 )
        {
            printf( "Cannot attach gate with more than 6 inputs to node %s.\n", Abc_ObjName(pNode) );
            ABC_FREE( puTruthGates[0] );
            ABC_FREE( puTruthGates );
            ABC_FREE( ppGates );
            return 0;
        }
        else if ( !Abc_NodeAttach( pNode, ppGates, puTruthGates, nGates, uTruths ) )
        {
            printf( "Could not attach the library gate to node %s.\n", Abc_ObjName(pNode) );
            ABC_FREE( puTruthGates[0] );
            ABC_FREE( puTruthGates );
            ABC_FREE( ppGates );
            return 0;
        }
    }
    ABC_FREE( puTruthGates[0] );
    ABC_FREE( puTruthGates );
    ABC_FREE( ppGates );
    ABC_FREE( s_pPerms );

    // perform the final transformation
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
        if ( pNode->pCopy == NULL )
        {
            printf( "Some elementary gates (constant, buffer, or inverter) are missing in the library.\n" );
            return 0;
        }
    }

    // replace SOP representation by the gate representation
    Abc_NtkForEachNode( pNtk, pNode, i )
        pNode->pData = pNode->pCopy, pNode->pCopy = NULL;
    pNtk->ntkFunc = ABC_FUNC_MAP;
    Extra_MmFlexStop( (Extra_MmFlex_t *)pNtk->pManFunc );
    pNtk->pManFunc = pGenlib;

    printf( "Library gates are successfully attached to the nodes.\n" );

    // make sure that everything is okay
    if ( !Abc_NtkCheck( pNtk ) )
    {
        printf( "Abc_NtkAttach: The network check has failed.\n" );
        return 0;
    }
    return 1;
}